

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnShadedPalCommand::Execute
          (DrawColumnShadedPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  
  iVar9 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar2 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar12 = thread->pass_end_y - iVar9;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar2 < iVar12) {
    iVar12 = iVar2;
  }
  uVar11 = thread->pass_start_y - iVar9;
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  iVar2 = thread->num_cores;
  iVar9 = (iVar2 - (int)((iVar9 + uVar11) - thread->core) % iVar2) % iVar2;
  uVar6 = (long)(int)((~uVar11 + iVar2 + iVar12) - iVar9) / (long)iVar2;
  uVar7 = uVar6 & 0xffffffff;
  if (0 < (int)uVar6) {
    iVar12 = (this->super_PalColumnCommand)._pitch;
    iVar9 = iVar9 + uVar11;
    pbVar10 = (this->super_PalColumnCommand)._dest + iVar12 * iVar9;
    iVar3 = (this->super_PalColumnCommand)._iscale;
    iVar8 = iVar9 * iVar3 + (this->super_PalColumnCommand)._texturefrac;
    puVar4 = (this->super_PalColumnCommand)._source;
    iVar9 = (this->super_PalColumnCommand)._color;
    puVar5 = (this->super_PalColumnCommand)._colormap;
    do {
      bVar1 = puVar5[puVar4[iVar8 >> 0x10]];
      uVar11 = Col2RGB8[0x40 - bVar1][*pbVar10] + Col2RGB8[bVar1][iVar9] | 0x1f07c1f;
      *pbVar10 = RGB32k.All[uVar11 >> 0xf & uVar11];
      pbVar10 = pbVar10 + iVar12 * iVar2;
      iVar8 = iVar8 + iVar3 * iVar2;
      uVar11 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar11;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void DrawColumnShadedPalCommand::Execute(DrawerThread *thread)
	{
		int  count;
		uint8_t *dest;
		fixed_t frac, fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		uint32_t *fgstart = &Col2RGB8[0][_color];

		do
		{
			uint32_t val = colormap[source[frac >> FRACBITS]];
			uint32_t fg = fgstart[val << 8];
			val = (Col2RGB8[64 - val][*dest] + fg) | 0x1f07c1f;
			*dest = RGB32k.All[val & (val >> 15)];

			dest += pitch;
			frac += fracstep;
		} while (--count);
	}